

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_numbers.c
# Opt level: O0

FIOBJ fiobj_num_new_bignum(intptr_t num)

{
  undefined8 *puVar1;
  int *piVar2;
  undefined4 local_28;
  fiobj_num_s *o;
  intptr_t num_local;
  
  puVar1 = (undefined8 *)fio_malloc(0x10);
  if (puVar1 == (undefined8 *)0x0) {
    perror("ERROR: fiobj number couldn\'t allocate memory");
    piVar2 = __errno_location();
    exit(*piVar2);
  }
  local_28 = CONCAT31(local_28._1_3_,1);
  *puVar1 = CONCAT44(1,local_28);
  puVar1[1] = num;
  return (FIOBJ)puVar1;
}

Assistant:

FIOBJ fiobj_num_new_bignum(intptr_t num) {
  fiobj_num_s *o = fio_malloc(sizeof(*o));
  if (!o) {
    perror("ERROR: fiobj number couldn't allocate memory");
    exit(errno);
  }
  *o = (fiobj_num_s){
      .head =
          {
              .type = FIOBJ_T_NUMBER,
              .ref = 1,
          },
      .i = num,
  };
  return (FIOBJ)o;
}